

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilEnum.c
# Opt level: O3

void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *p,int fNew,int iNode1st)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  char *pcVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  char *pcVar22;
  word *pwVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  bool bVar27;
  int local_98;
  int local_94;
  uint local_88;
  long local_80;
  
  uVar12 = (ulong)(uint)p->nNodes;
  bVar27 = fNew != 0;
  do {
    bVar8 = bVar27;
    iVar9 = (int)uVar12;
    iVar14 = p->nNodeMax - iVar9;
    if (iVar14 == 0) {
      if (p->nTops == 1) {
        if (p->fVerbose != 0) {
          Kit_DsdPrintFromTruth((uint *)(p->pTruths + (long)iVar9 + -1),p->nVars);
          iVar9 = p->nVars;
          lVar26 = (long)iVar9;
          if (iVar9 < p->nNodes) {
            uVar25 = iVar9 + 0x61;
            do {
              if (p->Polar[lVar26] == 4) {
                printf("  %c=%c+%c",(ulong)uVar25,(ulong)(p->pFans0[lVar26] + 0x61),
                       (ulong)(p->pFans1[lVar26] + 0x61));
              }
              else {
                pcVar17 = "!";
                if (p->fCompl0[lVar26] == 0) {
                  pcVar17 = "";
                }
                pcVar22 = "!";
                if (p->fCompl1[lVar26] == 0) {
                  pcVar22 = "";
                }
                printf("  %c=%s%c%s%c",(ulong)uVar25,pcVar17,(ulong)(p->pFans0[lVar26] + 0x61),
                       pcVar22,(ulong)(p->pFans1[lVar26] + 0x61));
              }
              lVar26 = lVar26 + 1;
              uVar25 = uVar25 + 1;
            } while (lVar26 < p->nNodes);
          }
          putchar(10);
        }
        p->nFinished = p->nFinished + 1;
        return;
      }
      __assert_fail("p->nTops == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                    ,0x23b,"void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
    }
    if (bVar8) {
      local_88 = 1;
      local_80 = 0;
      iVar10 = iNode1st;
      local_94 = iVar9;
    }
    else {
      iVar10 = p->pFans0[(long)iVar9 + 0xf];
      local_80 = (long)p->pFans0[(long)iVar9 + -1];
      local_88 = p->fCompl1[(long)iVar9 + 0xf] + 1;
      local_94 = iNode1st;
    }
    iVar15 = p->nTops;
    if ((iVar15 < 1) || (iVar14 + 1 < iVar15)) {
      __assert_fail("p->nTops > 0 && p->nTops <= p->nNodeMax - n + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                    ,0x249,"void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
    }
    if (iVar10 < local_94) {
      uVar25 = p->fUseXor + 4;
      local_98 = (p->nNodeMax - (iVar15 + iVar9)) + 1;
      lVar16 = (long)iVar10;
      iVar14 = p->pLevel[lVar16];
      uVar13 = uVar12 & 0xffffffff;
      lVar26 = lVar16;
      do {
        iVar10 = p->pRefs[lVar26];
        if ((local_98 == 0) && (0 < iVar10)) {
          local_98 = 0;
        }
        else {
          local_98 = local_98 - (uint)(0 < iVar10);
          if (local_98 < 0) {
            __assert_fail("nRefedFans >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                          ,0x251,"void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
          }
          lVar24 = local_80;
          if (lVar26 != lVar16) {
            lVar24 = 0;
          }
          if (lVar24 < lVar26) {
            do {
              if ((local_98 != 0) || (p->pRefs[lVar24] < 1)) {
                iVar10 = (int)lVar24;
                if ((((iVar14 != 0) || ((p->pRefs[lVar24] != 0 || (p->pRefs[lVar26] != 0)))) ||
                    ((iVar10 + 1 == (int)lVar26 && ((lVar24 < 1 || (p->Polar[lVar24 + 0xf] != 0)))))
                    ) && ((p->pLevel[lVar26] != 0 ||
                          ((((p->pRefs[lVar26] != 0 || (lVar26 < 1)) || (p->pRefs[lVar24] == 0)) ||
                           (p->Polar[lVar26 + 0xf] != 0)))))) {
                  uVar18 = local_88;
                  if (lVar24 != local_80) {
                    uVar18 = 0;
                  }
                  uVar19 = (ulong)uVar18;
                  if (bVar8) {
                    uVar19 = 0;
                  }
                  if (lVar26 != lVar16) {
                    uVar19 = 0;
                  }
                  if ((int)uVar19 < (int)uVar25) {
                    do {
                      uVar18 = (uint)uVar19;
                      if ((((p->pLevel[lVar24] != 0) || ((uVar19 & 1) == 0)) ||
                          (p->pRefs[lVar24] != 0)) &&
                         (((p->pLevel[lVar26] != 0 || ((uVar19 & 2) == 0)) ||
                          (p->pRefs[lVar26] != 0)))) {
                        p->nTries = p->nTries + 1;
                        p->pFans0[iVar9] = iVar10;
                        p->pFans1[iVar9] = (int)lVar26;
                        p->fCompl0[iVar9] = uVar18 & 1;
                        p->fCompl1[iVar9] = (uint)(uVar19 >> 1) & 1;
                        p->Polar[iVar9] = uVar18;
                        if (uVar18 == 4) {
                          uVar13 = p->pTruths[lVar24] ^ p->pTruths[lVar26];
                        }
                        else {
                          uVar13 = (p->pTruths[lVar24] ^ (long)(int)-(uVar18 & 1)) &
                                   ((long)((int)(uVar18 << 0x1e) >> 0x1f) ^ p->pTruths[lVar26]);
                        }
                        p->pTruths[iVar9] = uVar13;
                        uVar13 = (ulong)p->nNodes;
                        uVar3 = p->pFans0[uVar13];
                        uVar4 = p->pFans1[uVar13];
                        uVar19 = (ulong)uVar4;
                        if ((int)uVar4 <= (int)uVar3) {
                          __assert_fail("i < k",
                                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                        ,0x20b,"int Abc_EnumerateFilter(Abc_EnuMan_t *)");
                        }
                        uVar5 = p->pTruths[uVar13];
                        if (uVar5 - 1 < 0xfffffffffffffffe) {
                          if (0 < p->nNodes) {
                            uVar20 = 0;
                            do {
                              if ((uVar5 == p->pTruths[uVar20]) ||
                                 ((p->pTruths[uVar20] ^ uVar5) == 0xffffffffffffffff))
                              goto LAB_00415a33;
                              uVar20 = uVar20 + 1;
                            } while (uVar13 != uVar20);
                          }
                          if (-1 < (int)uVar3) {
                            bVar27 = true;
                            uVar20 = 0;
                            pwVar23 = p->pTruths;
                            do {
                              pwVar23 = pwVar23 + 1;
                              if ((long)uVar20 < (long)(int)uVar4) {
                                lVar21 = 0;
                                do {
                                  if ((uVar20 != uVar3) || (uVar19 - 1 != lVar21)) {
                                    uVar6 = p->pTruths[uVar20];
                                    uVar7 = pwVar23[lVar21];
                                    if (((((uVar5 == (uVar7 & uVar6)) ||
                                          ((((uVar7 & uVar6 ^ uVar5) == 0xffffffffffffffff ||
                                            (uVar5 == (~uVar7 & uVar6))) ||
                                           ((~uVar7 & uVar6 ^ uVar5) == 0xffffffffffffffff)))) ||
                                         (((uVar5 == (~uVar6 & uVar7) ||
                                           ((~uVar6 & uVar7 ^ uVar5) == 0xffffffffffffffff)) ||
                                          (uVar5 == (uVar7 | uVar6))))) ||
                                        (((uVar7 | uVar6) ^ uVar5) == 0xffffffffffffffff)) ||
                                       ((p->fUseXor != 0 &&
                                        ((uVar5 == (uVar7 ^ uVar6) ||
                                         ((uVar7 ^ uVar6 ^ uVar5) == 0xffffffffffffffff)))))) {
                                      if (!bVar27) goto LAB_00415912;
                                      goto LAB_00415a33;
                                    }
                                  }
                                  lVar21 = lVar21 + 1;
                                } while ((int)uVar19 != (int)lVar21);
                              }
                              bVar27 = uVar20 < uVar3;
                              uVar20 = uVar20 + 1;
                              uVar19 = uVar19 - 1;
                            } while (uVar20 != uVar3 + 1);
                          }
LAB_00415912:
                          p->nBuilds = p->nBuilds + 1;
                          iVar15 = p->pLevel[lVar26];
                          if (p->pLevel[lVar26] < p->pLevel[lVar24]) {
                            iVar15 = p->pLevel[lVar24];
                          }
                          if (iVar14 != iVar15) {
                            __assert_fail("Level == Abc_MaxInt(p->pLevel[i], p->pLevel[k])",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                          ,0x273,
                                          "void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
                          }
                          p->pLevel[iVar9] = iVar14 + 1;
                          iVar15 = p->pRefs[iVar10];
                          if (iVar15 < 0) {
LAB_00415c07:
                            __assert_fail("p->pRefs[i] >= 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                          ,0x1ce,"void Abc_EnumRef(Abc_EnuMan_t *, int)");
                          }
                          p->pRefs[iVar10] = iVar15 + 1;
                          if (iVar15 == 0) {
                            p->nTops = p->nTops + -1;
                          }
                          iVar15 = p->pRefs[p->pFans1[iVar9]];
                          if (iVar15 < 0) goto LAB_00415c07;
                          p->pRefs[p->pFans1[iVar9]] = iVar15 + 1;
                          p->nTops = (p->nTops + 1) - (uint)(iVar15 == 0);
                          iVar15 = p->nNodes;
                          p->nNodes = iVar15 + 1;
                          if (iVar15 < iVar9) {
                            __assert_fail("i < p->nNodes",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                          ,0x1de,"void Abc_EnumRefNode(Abc_EnuMan_t *, int)");
                          }
                          Abc_EnumerateFuncs_rec(p,0,local_94);
                          uVar13 = uVar12 & 0xffffffff;
                          if (p->nNodes <= iVar9) {
                            __assert_fail("i < p->nNodes",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                          ,0x1e2,"void Abc_EnumDerefNode(Abc_EnuMan_t *, int)");
                          }
                          iVar15 = p->pFans0[iVar9];
                          iVar11 = p->pRefs[iVar15] + -1;
                          p->pRefs[iVar15] = iVar11;
                          if (iVar11 == 0) {
                            p->nTops = p->nTops + 1;
                            iVar11 = p->pRefs[iVar15];
                          }
                          if (iVar11 < 0) {
LAB_00415be8:
                            __assert_fail("p->pRefs[i] >= 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                          ,0x1d6,"void Abc_EnumDeref(Abc_EnuMan_t *, int)");
                          }
                          iVar15 = p->pFans1[iVar9];
                          iVar11 = p->pRefs[iVar15] + -1;
                          p->pRefs[iVar15] = iVar11;
                          if (iVar11 == 0) {
                            p->nTops = p->nTops + 1;
                            iVar11 = p->pRefs[iVar15];
                          }
                          if (iVar11 < 0) goto LAB_00415be8;
                          uVar1 = p->nNodes;
                          uVar2 = p->nTops;
                          p->nNodes = uVar1 + -1;
                          p->nTops = uVar2 + -1;
                          if (iVar9 != uVar1 + -1) {
                            __assert_fail("n == p->nNodes",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                          ,0x278,
                                          "void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
                          }
                        }
                      }
LAB_00415a33:
                      uVar19 = (ulong)(uVar18 + 1);
                    } while (uVar18 + 1 != uVar25);
                  }
                }
              }
              lVar24 = lVar24 + 1;
            } while (lVar24 < lVar26);
            iVar10 = p->pRefs[lVar26];
          }
          local_98 = local_98 + (uint)(0 < iVar10);
        }
        lVar26 = lVar26 + 1;
      } while (local_94 != (int)lVar26);
    }
    else {
      uVar13 = uVar12 & 0xffffffff;
    }
    uVar12 = uVar13;
    bVar27 = true;
    if (bVar8) {
      return;
    }
  } while( true );
}

Assistant:

void Abc_EnumerateFuncs_rec( Abc_EnuMan_t * p, int fNew, int iNode1st ) // the first node on the last level
{
    if ( p->nNodes == p->nNodeMax )
    {
        assert( p->nTops == 1 );
        if ( p->fVerbose )
            Abc_EnumPrintOne( p );
        p->nFinished++;
        return;
    }
    {
    int i, k, c, cLim = 4 + p->fUseXor, n = p->nNodes;
    int nRefedFans = p->nNodeMax - n + 1 - p->nTops;
    int high0 = fNew ? iNode1st : p->pFans1[n-1];
    int high1 = fNew ? n        : iNode1st;
    int low0  = fNew ? 0        : p->pFans0[n-1];
    int c0    = fNew ? 0        : p->Polar[n-1];
    int Level = p->pLevel[high0];
    assert( p->nTops > 0 && p->nTops <= p->nNodeMax - n + 1 );
    // go through nodes 
    for ( k = high0; k < high1; k++ )
    {
        if ( nRefedFans == 0 && p->pRefs[k] > 0 )
            continue;
        if ( p->pRefs[k] > 0 )
            nRefedFans--;
        assert( nRefedFans >= 0 );
        // try second fanin
        for ( i = (k == high0) ? low0 : 0; i < k; i++ )
        {
            if ( nRefedFans == 0 && p->pRefs[i] > 0 )
                continue;
            if ( Level == 0 && p->pRefs[i] == 0 && p->pRefs[k] == 0 && (i+1 != k || (i > 0 && p->pRefs[i-1] == 0)) ) // NPN
                continue;
            if ( p->pLevel[k] == 0 && p->pRefs[k] == 0 && p->pRefs[i] != 0 && k > 0 && p->pRefs[k-1] == 0 ) // NPN
                continue;
//            if ( p->pLevel[i] == 0 && p->pRefs[i] == 0 && p->pRefs[k] != 0 && i > 0 && p->pRefs[i-1] == 0 ) // NPN
//                continue;
            // try four polarities
            for ( c = (k == high0 && i == low0 && !fNew) ? c0 + 1 : 0; c < cLim; c++ )
            {
                if ( p->pLevel[i] == 0 && p->pRefs[i] == 0 && (c & 1) == 1 ) // NPN
                    continue;
                if ( p->pLevel[k] == 0 && p->pRefs[k] == 0 && (c & 2) == 2 ) // NPN
                    continue;
                p->nTries++;
                // create node
                assert( i < k );
                p->pFans0[n]  = i;
                p->pFans1[n]  = k;
                p->fCompl0[n] = c & 1;
                p->fCompl1[n] = (c >> 1) & 1;
                p->Polar[n]   = c;
                if ( c == 4 )
                    p->pTruths[n] = p->pTruths[i] ^ p->pTruths[k];
                else
                    p->pTruths[n] = ((c & 1) ? ~p->pTruths[i] : p->pTruths[i]) & ((c & 2) ? ~p->pTruths[k] : p->pTruths[k]);
                if ( Abc_EnumerateFilter(p) )
                    continue;
                p->nBuilds++;
                assert( Level == Abc_MaxInt(p->pLevel[i], p->pLevel[k]) );
                p->pLevel[n]  = Level + 1;
                Abc_EnumRefNode( p, n );
                Abc_EnumerateFuncs_rec( p, 0, fNew ? n : iNode1st );
                Abc_EnumDerefNode( p, n );
                assert( n == p->nNodes );
            }
        }
        if ( p->pRefs[k] > 0 )
            nRefedFans++;
    }
    if ( fNew )
        return;
    // start a new level
    Abc_EnumerateFuncs_rec( p, 1, iNode1st );
    }
}